

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iadst8x8_new_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  __m128i offset;
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  undefined1 auVar10 [16];
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar20;
  int iVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar29;
  uint uVar30;
  undefined1 auVar28 [16];
  uint uVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar39;
  int iVar40;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar41;
  int iVar42;
  uint uVar43;
  int iVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  undefined1 auVar44 [16];
  int iVar49;
  uint uVar50;
  undefined1 auVar51 [16];
  int iVar52;
  uint uVar53;
  int iVar55;
  uint uVar56;
  int iVar57;
  uint uVar58;
  undefined1 auVar54 [16];
  int iVar59;
  uint uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  int iVar70;
  int iVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  int iVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  undefined1 auVar69 [16];
  int iVar82;
  uint uVar83;
  int iVar87;
  uint uVar88;
  int iVar89;
  uint uVar90;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar91;
  uint uVar92;
  int iVar93;
  int iVar94;
  int iVar96;
  int iVar97;
  undefined1 auVar95 [16];
  int iVar98;
  undefined1 local_48 [16];
  
  lVar3 = (long)bit * 0x100;
  iVar94 = *(int *)((long)vert_filter_length_chroma + lVar3 + 0x220);
  iVar4 = 1 << ((char)bit - 1U & 0x1f);
  local_48._4_4_ = -iVar94;
  iVar5 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar2 = 0x8000;
  if (0xf < iVar5) {
    iVar2 = 1 << ((char)iVar5 - 1U & 0x1f);
  }
  auVar7 = ZEXT416((uint)bit);
  iVar5 = -iVar2;
  iVar2 = iVar2 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x170);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x250);
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1b0);
  auVar85._4_4_ = uVar1;
  auVar85._0_4_ = uVar1;
  auVar85._8_4_ = uVar1;
  auVar85._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x210);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1f0);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1d0);
  auVar86._4_4_ = uVar1;
  auVar86._0_4_ = uVar1;
  auVar86._8_4_ = uVar1;
  auVar86._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x230);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 400);
  auVar95._4_4_ = uVar1;
  auVar95._0_4_ = uVar1;
  auVar95._8_4_ = uVar1;
  auVar95._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1a0);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  local_48._0_4_ = local_48._4_4_;
  local_48._8_4_ = local_48._4_4_;
  local_48._12_4_ = local_48._4_4_;
  auVar10 = pmulld((undefined1  [16])in[7],auVar19);
  auVar18 = pmulld(auVar19,(undefined1  [16])*in);
  auVar84 = pmulld((undefined1  [16])*in,auVar68);
  auVar44 = pmulld((undefined1  [16])in[7],auVar68);
  auVar19 = pmulld((undefined1  [16])in[5],auVar85);
  auVar61 = pmulld(auVar85,(undefined1  [16])in[2]);
  auVar85 = pmulld((undefined1  [16])in[2],auVar67);
  auVar54 = pmulld((undefined1  [16])in[5],auVar67);
  auVar68 = pmulld((undefined1  [16])in[3],auVar62);
  auVar37 = pmulld(auVar62,(undefined1  [16])in[4]);
  auVar62 = pmulld((undefined1  [16])in[4],auVar86);
  auVar86 = pmulld((undefined1  [16])in[3],auVar86);
  auVar38 = pmulld((undefined1  [16])in[1],auVar51);
  auVar6 = pmulld(auVar51,(undefined1  [16])in[6]);
  auVar51 = pmulld((undefined1  [16])in[6],auVar95);
  auVar95 = pmulld((undefined1  [16])in[1],auVar95);
  iVar8 = auVar10._0_4_ + iVar4 + auVar84._0_4_ >> auVar7;
  iVar11 = auVar10._4_4_ + iVar4 + auVar84._4_4_ >> auVar7;
  iVar13 = auVar10._8_4_ + iVar4 + auVar84._8_4_ >> auVar7;
  iVar15 = auVar10._12_4_ + iVar4 + auVar84._12_4_ >> auVar7;
  iVar42 = (auVar44._0_4_ + iVar4) - auVar18._0_4_ >> auVar7;
  iVar45 = (auVar44._4_4_ + iVar4) - auVar18._4_4_ >> auVar7;
  iVar47 = (auVar44._8_4_ + iVar4) - auVar18._8_4_ >> auVar7;
  iVar49 = (auVar44._12_4_ + iVar4) - auVar18._12_4_ >> auVar7;
  iVar17 = auVar19._0_4_ + iVar4 + auVar85._0_4_ >> auVar7;
  iVar20 = auVar19._4_4_ + iVar4 + auVar85._4_4_ >> auVar7;
  iVar21 = auVar19._8_4_ + iVar4 + auVar85._8_4_ >> auVar7;
  iVar22 = auVar19._12_4_ + iVar4 + auVar85._12_4_ >> auVar7;
  iVar52 = (auVar54._0_4_ + iVar4) - auVar61._0_4_ >> auVar7;
  iVar55 = (auVar54._4_4_ + iVar4) - auVar61._4_4_ >> auVar7;
  iVar57 = (auVar54._8_4_ + iVar4) - auVar61._8_4_ >> auVar7;
  iVar59 = (auVar54._12_4_ + iVar4) - auVar61._12_4_ >> auVar7;
  iVar63 = auVar68._0_4_ + iVar4 + auVar62._0_4_ >> auVar7;
  iVar70 = auVar68._4_4_ + iVar4 + auVar62._4_4_ >> auVar7;
  iVar74 = auVar68._8_4_ + iVar4 + auVar62._8_4_ >> auVar7;
  iVar78 = auVar68._12_4_ + iVar4 + auVar62._12_4_ >> auVar7;
  iVar82 = (auVar86._0_4_ + iVar4) - auVar37._0_4_ >> auVar7;
  iVar87 = (auVar86._4_4_ + iVar4) - auVar37._4_4_ >> auVar7;
  iVar89 = (auVar86._8_4_ + iVar4) - auVar37._8_4_ >> auVar7;
  iVar91 = (auVar86._12_4_ + iVar4) - auVar37._12_4_ >> auVar7;
  iVar36 = auVar38._0_4_ + iVar4 + auVar51._0_4_ >> auVar7;
  iVar39 = auVar38._4_4_ + iVar4 + auVar51._4_4_ >> auVar7;
  iVar40 = auVar38._8_4_ + iVar4 + auVar51._8_4_ >> auVar7;
  iVar41 = auVar38._12_4_ + iVar4 + auVar51._12_4_ >> auVar7;
  iVar93 = (auVar95._0_4_ + iVar4) - auVar6._0_4_ >> auVar7;
  iVar96 = (auVar95._4_4_ + iVar4) - auVar6._4_4_ >> auVar7;
  iVar97 = (auVar95._8_4_ + iVar4) - auVar6._8_4_ >> auVar7;
  iVar98 = (auVar95._12_4_ + iVar4) - auVar6._12_4_ >> auVar7;
  iVar32 = iVar63 + iVar8;
  iVar33 = iVar70 + iVar11;
  iVar34 = iVar74 + iVar13;
  iVar35 = iVar78 + iVar15;
  iVar8 = iVar8 - iVar63;
  iVar11 = iVar11 - iVar70;
  iVar13 = iVar13 - iVar74;
  iVar15 = iVar15 - iVar78;
  uVar9 = (uint)(iVar8 < iVar5) * iVar5 | (uint)(iVar8 >= iVar5) * iVar8;
  uVar12 = (uint)(iVar11 < iVar5) * iVar5 | (uint)(iVar11 >= iVar5) * iVar11;
  uVar14 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  auVar10._0_4_ = (uint)(iVar2 < (int)uVar9) * iVar2 | (iVar2 >= (int)uVar9) * uVar9;
  auVar10._4_4_ = (uint)(iVar2 < (int)uVar12) * iVar2 | (iVar2 >= (int)uVar12) * uVar12;
  auVar10._8_4_ = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  auVar10._12_4_ = (uint)(iVar2 < (int)uVar16) * iVar2 | (iVar2 >= (int)uVar16) * uVar16;
  iVar63 = iVar82 + iVar42;
  iVar70 = iVar87 + iVar45;
  iVar74 = iVar89 + iVar47;
  iVar78 = iVar91 + iVar49;
  iVar42 = iVar42 - iVar82;
  iVar45 = iVar45 - iVar87;
  iVar47 = iVar47 - iVar89;
  iVar49 = iVar49 - iVar91;
  uVar9 = (uint)(iVar42 < iVar5) * iVar5 | (uint)(iVar42 >= iVar5) * iVar42;
  uVar12 = (uint)(iVar45 < iVar5) * iVar5 | (uint)(iVar45 >= iVar5) * iVar45;
  uVar14 = (uint)(iVar47 < iVar5) * iVar5 | (uint)(iVar47 >= iVar5) * iVar47;
  uVar16 = (uint)(iVar49 < iVar5) * iVar5 | (uint)(iVar49 >= iVar5) * iVar49;
  auVar61._0_4_ = (uint)(iVar2 < (int)uVar9) * iVar2 | (iVar2 >= (int)uVar9) * uVar9;
  auVar61._4_4_ = (uint)(iVar2 < (int)uVar12) * iVar2 | (iVar2 >= (int)uVar12) * uVar12;
  auVar61._8_4_ = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  auVar61._12_4_ = (uint)(iVar2 < (int)uVar16) * iVar2 | (iVar2 >= (int)uVar16) * uVar16;
  iVar42 = iVar36 + iVar17;
  iVar45 = iVar39 + iVar20;
  iVar47 = iVar40 + iVar21;
  iVar49 = iVar41 + iVar22;
  iVar17 = iVar17 - iVar36;
  iVar20 = iVar20 - iVar39;
  iVar21 = iVar21 - iVar40;
  iVar22 = iVar22 - iVar41;
  uVar9 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  uVar12 = (uint)(iVar20 < iVar5) * iVar5 | (uint)(iVar20 >= iVar5) * iVar20;
  uVar14 = (uint)(iVar21 < iVar5) * iVar5 | (uint)(iVar21 >= iVar5) * iVar21;
  uVar16 = (uint)(iVar22 < iVar5) * iVar5 | (uint)(iVar22 >= iVar5) * iVar22;
  auVar37._0_4_ = (uint)(iVar2 < (int)uVar9) * iVar2 | (iVar2 >= (int)uVar9) * uVar9;
  auVar37._4_4_ = (uint)(iVar2 < (int)uVar12) * iVar2 | (iVar2 >= (int)uVar12) * uVar12;
  auVar37._8_4_ = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  auVar37._12_4_ = (uint)(iVar2 < (int)uVar16) * iVar2 | (iVar2 >= (int)uVar16) * uVar16;
  iVar8 = iVar93 + iVar52;
  iVar11 = iVar96 + iVar55;
  iVar13 = iVar97 + iVar57;
  iVar15 = iVar98 + iVar59;
  iVar52 = iVar52 - iVar93;
  iVar55 = iVar55 - iVar96;
  iVar57 = iVar57 - iVar97;
  iVar59 = iVar59 - iVar98;
  uVar9 = (uint)(iVar52 < iVar5) * iVar5 | (uint)(iVar52 >= iVar5) * iVar52;
  uVar12 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar14 = (uint)(iVar57 < iVar5) * iVar5 | (uint)(iVar57 >= iVar5) * iVar57;
  uVar16 = (uint)(iVar59 < iVar5) * iVar5 | (uint)(iVar59 >= iVar5) * iVar59;
  auVar84._0_4_ = (uint)(iVar2 < (int)uVar9) * iVar2 | (iVar2 >= (int)uVar9) * uVar9;
  auVar84._4_4_ = (uint)(iVar2 < (int)uVar12) * iVar2 | (iVar2 >= (int)uVar12) * uVar12;
  auVar84._8_4_ = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  auVar84._12_4_ = (uint)(iVar2 < (int)uVar16) * iVar2 | (iVar2 >= (int)uVar16) * uVar16;
  auVar19 = pmulld(auVar10,auVar28);
  auVar44 = pmulld(auVar37,local_48);
  auVar51 = pmulld(local_48,auVar84);
  auVar38 = pmulld(auVar84,auVar28);
  auVar18 = pmulld(auVar37,auVar28);
  auVar37 = pmulld(auVar28,auVar61);
  auVar6._4_4_ = iVar94;
  auVar6._0_4_ = iVar94;
  auVar6._8_4_ = iVar94;
  auVar6._12_4_ = iVar94;
  auVar95 = pmulld(auVar61,auVar6);
  auVar6 = pmulld(auVar10,auVar6);
  uVar9 = (uint)(iVar32 < iVar5) * iVar5 | (uint)(iVar32 >= iVar5) * iVar32;
  uVar12 = (uint)(iVar33 < iVar5) * iVar5 | (uint)(iVar33 >= iVar5) * iVar33;
  uVar14 = (uint)(iVar34 < iVar5) * iVar5 | (uint)(iVar34 >= iVar5) * iVar34;
  uVar16 = (uint)(iVar35 < iVar5) * iVar5 | (uint)(iVar35 >= iVar5) * iVar35;
  uVar9 = (uint)(iVar2 < (int)uVar9) * iVar2 | (iVar2 >= (int)uVar9) * uVar9;
  uVar12 = (uint)(iVar2 < (int)uVar12) * iVar2 | (iVar2 >= (int)uVar12) * uVar12;
  uVar14 = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  uVar16 = (uint)(iVar2 < (int)uVar16) * iVar2 | (iVar2 >= (int)uVar16) * uVar16;
  uVar64 = (uint)(iVar63 < iVar5) * iVar5 | (uint)(iVar63 >= iVar5) * iVar63;
  uVar71 = (uint)(iVar70 < iVar5) * iVar5 | (uint)(iVar70 >= iVar5) * iVar70;
  uVar75 = (uint)(iVar74 < iVar5) * iVar5 | (uint)(iVar74 >= iVar5) * iVar74;
  uVar79 = (uint)(iVar78 < iVar5) * iVar5 | (uint)(iVar78 >= iVar5) * iVar78;
  uVar65 = (uint)(iVar2 < (int)uVar64) * iVar2 | (iVar2 >= (int)uVar64) * uVar64;
  uVar72 = (uint)(iVar2 < (int)uVar71) * iVar2 | (iVar2 >= (int)uVar71) * uVar71;
  uVar76 = (uint)(iVar2 < (int)uVar75) * iVar2 | (iVar2 >= (int)uVar75) * uVar75;
  uVar80 = (uint)(iVar2 < (int)uVar79) * iVar2 | (iVar2 >= (int)uVar79) * uVar79;
  uVar64 = (uint)(iVar42 < iVar5) * iVar5 | (uint)(iVar42 >= iVar5) * iVar42;
  uVar71 = (uint)(iVar45 < iVar5) * iVar5 | (uint)(iVar45 >= iVar5) * iVar45;
  uVar75 = (uint)(iVar47 < iVar5) * iVar5 | (uint)(iVar47 >= iVar5) * iVar47;
  uVar79 = (uint)(iVar49 < iVar5) * iVar5 | (uint)(iVar49 >= iVar5) * iVar49;
  uVar83 = (uint)(iVar2 < (int)uVar64) * iVar2 | (iVar2 >= (int)uVar64) * uVar64;
  uVar88 = (uint)(iVar2 < (int)uVar71) * iVar2 | (iVar2 >= (int)uVar71) * uVar71;
  uVar90 = (uint)(iVar2 < (int)uVar75) * iVar2 | (iVar2 >= (int)uVar75) * uVar75;
  uVar92 = (uint)(iVar2 < (int)uVar79) * iVar2 | (iVar2 >= (int)uVar79) * uVar79;
  uVar64 = (uint)(iVar8 < iVar5) * iVar5 | (uint)(iVar8 >= iVar5) * iVar8;
  uVar71 = (uint)(iVar11 < iVar5) * iVar5 | (uint)(iVar11 >= iVar5) * iVar11;
  uVar75 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar79 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar64 = (uint)(iVar2 < (int)uVar64) * iVar2 | (iVar2 >= (int)uVar64) * uVar64;
  uVar71 = (uint)(iVar2 < (int)uVar71) * iVar2 | (iVar2 >= (int)uVar71) * uVar71;
  uVar75 = (uint)(iVar2 < (int)uVar75) * iVar2 | (iVar2 >= (int)uVar75) * uVar75;
  uVar79 = (uint)(iVar2 < (int)uVar79) * iVar2 | (iVar2 >= (int)uVar79) * uVar79;
  iVar35 = auVar19._0_4_ + iVar4 + auVar95._0_4_ >> auVar7;
  iVar36 = auVar19._4_4_ + iVar4 + auVar95._4_4_ >> auVar7;
  iVar39 = auVar19._8_4_ + iVar4 + auVar95._8_4_ >> auVar7;
  iVar40 = auVar19._12_4_ + iVar4 + auVar95._12_4_ >> auVar7;
  iVar15 = (auVar6._0_4_ + iVar4) - auVar37._0_4_ >> auVar7;
  iVar17 = (auVar6._4_4_ + iVar4) - auVar37._4_4_ >> auVar7;
  iVar20 = (auVar6._8_4_ + iVar4) - auVar37._8_4_ >> auVar7;
  iVar21 = (auVar6._12_4_ + iVar4) - auVar37._12_4_ >> auVar7;
  iVar94 = auVar44._0_4_ + iVar4 + auVar38._0_4_ >> auVar7;
  iVar8 = auVar44._4_4_ + iVar4 + auVar38._4_4_ >> auVar7;
  iVar11 = auVar44._8_4_ + iVar4 + auVar38._8_4_ >> auVar7;
  iVar13 = auVar44._12_4_ + iVar4 + auVar38._12_4_ >> auVar7;
  local_48._0_4_ = auVar51._0_4_;
  local_48._4_4_ = auVar51._4_4_;
  local_48._8_4_ = auVar51._8_4_;
  local_48._12_4_ = auVar51._12_4_;
  iVar22 = (auVar18._0_4_ + iVar4) - local_48._0_4_ >> auVar7;
  iVar32 = (auVar18._4_4_ + iVar4) - local_48._4_4_ >> auVar7;
  iVar33 = (auVar18._8_4_ + iVar4) - local_48._8_4_ >> auVar7;
  iVar34 = (auVar18._12_4_ + iVar4) - local_48._12_4_ >> auVar7;
  iVar41 = uVar83 + uVar9;
  iVar42 = uVar88 + uVar12;
  iVar45 = uVar90 + uVar14;
  iVar47 = uVar92 + uVar16;
  iVar49 = uVar9 - uVar83;
  iVar52 = uVar12 - uVar88;
  iVar55 = uVar14 - uVar90;
  iVar57 = uVar16 - uVar92;
  iVar78 = uVar64 + uVar65;
  iVar82 = uVar71 + uVar72;
  iVar87 = uVar75 + uVar76;
  iVar89 = uVar79 + uVar80;
  iVar91 = uVar65 - uVar64;
  iVar93 = uVar72 - uVar71;
  iVar96 = uVar76 - uVar75;
  iVar97 = uVar80 - uVar79;
  iVar59 = iVar94 + iVar35;
  iVar63 = iVar8 + iVar36;
  iVar70 = iVar11 + iVar39;
  iVar74 = iVar13 + iVar40;
  iVar35 = iVar35 - iVar94;
  iVar36 = iVar36 - iVar8;
  iVar39 = iVar39 - iVar11;
  iVar40 = iVar40 - iVar13;
  iVar94 = iVar22 + iVar15;
  iVar8 = iVar32 + iVar17;
  iVar11 = iVar33 + iVar20;
  iVar13 = iVar34 + iVar21;
  iVar15 = iVar15 - iVar22;
  iVar17 = iVar17 - iVar32;
  iVar20 = iVar20 - iVar33;
  iVar21 = iVar21 - iVar34;
  uVar9 = (uint)(iVar41 < iVar5) * iVar5 | (uint)(iVar41 >= iVar5) * iVar41;
  uVar12 = (uint)(iVar42 < iVar5) * iVar5 | (uint)(iVar42 >= iVar5) * iVar42;
  uVar14 = (uint)(iVar45 < iVar5) * iVar5 | (uint)(iVar45 >= iVar5) * iVar45;
  uVar16 = (uint)(iVar47 < iVar5) * iVar5 | (uint)(iVar47 >= iVar5) * iVar47;
  uVar64 = (uint)(iVar49 < iVar5) * iVar5 | (uint)(iVar49 >= iVar5) * iVar49;
  uVar71 = (uint)(iVar52 < iVar5) * iVar5 | (uint)(iVar52 >= iVar5) * iVar52;
  uVar75 = (uint)(iVar55 < iVar5) * iVar5 | (uint)(iVar55 >= iVar5) * iVar55;
  uVar79 = (uint)(iVar57 < iVar5) * iVar5 | (uint)(iVar57 >= iVar5) * iVar57;
  uVar53 = (uint)(iVar78 < iVar5) * iVar5 | (uint)(iVar78 >= iVar5) * iVar78;
  uVar56 = (uint)(iVar82 < iVar5) * iVar5 | (uint)(iVar82 >= iVar5) * iVar82;
  uVar58 = (uint)(iVar87 < iVar5) * iVar5 | (uint)(iVar87 >= iVar5) * iVar87;
  uVar60 = (uint)(iVar89 < iVar5) * iVar5 | (uint)(iVar89 >= iVar5) * iVar89;
  uVar66 = (uint)(iVar91 < iVar5) * iVar5 | (uint)(iVar91 >= iVar5) * iVar91;
  uVar73 = (uint)(iVar93 < iVar5) * iVar5 | (uint)(iVar93 >= iVar5) * iVar93;
  uVar77 = (uint)(iVar96 < iVar5) * iVar5 | (uint)(iVar96 >= iVar5) * iVar96;
  uVar81 = (uint)(iVar97 < iVar5) * iVar5 | (uint)(iVar97 >= iVar5) * iVar97;
  uVar43 = (uint)(iVar59 < iVar5) * iVar5 | (uint)(iVar59 >= iVar5) * iVar59;
  uVar46 = (uint)(iVar63 < iVar5) * iVar5 | (uint)(iVar63 >= iVar5) * iVar63;
  uVar48 = (uint)(iVar70 < iVar5) * iVar5 | (uint)(iVar70 >= iVar5) * iVar70;
  uVar50 = (uint)(iVar74 < iVar5) * iVar5 | (uint)(iVar74 >= iVar5) * iVar74;
  uVar23 = (uint)(iVar35 < iVar5) * iVar5 | (uint)(iVar35 >= iVar5) * iVar35;
  uVar24 = (uint)(iVar36 < iVar5) * iVar5 | (uint)(iVar36 >= iVar5) * iVar36;
  uVar25 = (uint)(iVar39 < iVar5) * iVar5 | (uint)(iVar39 >= iVar5) * iVar39;
  uVar26 = (uint)(iVar40 < iVar5) * iVar5 | (uint)(iVar40 >= iVar5) * iVar40;
  uVar65 = (uint)(iVar94 < iVar5) * iVar5 | (uint)(iVar94 >= iVar5) * iVar94;
  uVar72 = (uint)(iVar8 < iVar5) * iVar5 | (uint)(iVar8 >= iVar5) * iVar8;
  uVar76 = (uint)(iVar11 < iVar5) * iVar5 | (uint)(iVar11 >= iVar5) * iVar11;
  uVar80 = (uint)(iVar13 < iVar5) * iVar5 | (uint)(iVar13 >= iVar5) * iVar13;
  uVar83 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
  uVar88 = (uint)(iVar17 < iVar5) * iVar5 | (uint)(iVar17 >= iVar5) * iVar17;
  uVar90 = (uint)(iVar20 < iVar5) * iVar5 | (uint)(iVar20 >= iVar5) * iVar20;
  uVar92 = (uint)(iVar21 < iVar5) * iVar5 | (uint)(iVar21 >= iVar5) * iVar21;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar3 + 0x1e0);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  uVar27 = (uint)(iVar2 < (int)uVar9) * iVar2 | (iVar2 >= (int)uVar9) * uVar9;
  uVar29 = (uint)(iVar2 < (int)uVar12) * iVar2 | (iVar2 >= (int)uVar12) * uVar12;
  uVar30 = (uint)(iVar2 < (int)uVar14) * iVar2 | (iVar2 >= (int)uVar14) * uVar14;
  uVar31 = (uint)(iVar2 < (int)uVar16) * iVar2 | (iVar2 >= (int)uVar16) * uVar16;
  auVar44._0_4_ = (uint)(iVar2 < (int)uVar64) * iVar2 | (iVar2 >= (int)uVar64) * uVar64;
  auVar44._4_4_ = (uint)(iVar2 < (int)uVar71) * iVar2 | (iVar2 >= (int)uVar71) * uVar71;
  auVar44._8_4_ = (uint)(iVar2 < (int)uVar75) * iVar2 | (iVar2 >= (int)uVar75) * uVar75;
  auVar44._12_4_ = (uint)(iVar2 < (int)uVar79) * iVar2 | (iVar2 >= (int)uVar79) * uVar79;
  uVar64 = (uint)(iVar2 < (int)uVar53) * iVar2 | (iVar2 >= (int)uVar53) * uVar53;
  uVar71 = (uint)(iVar2 < (int)uVar56) * iVar2 | (iVar2 >= (int)uVar56) * uVar56;
  uVar75 = (uint)(iVar2 < (int)uVar58) * iVar2 | (iVar2 >= (int)uVar58) * uVar58;
  uVar79 = (uint)(iVar2 < (int)uVar60) * iVar2 | (iVar2 >= (int)uVar60) * uVar60;
  auVar69._0_4_ = (uint)(iVar2 < (int)uVar66) * iVar2 | (iVar2 >= (int)uVar66) * uVar66;
  auVar69._4_4_ = (uint)(iVar2 < (int)uVar73) * iVar2 | (iVar2 >= (int)uVar73) * uVar73;
  auVar69._8_4_ = (uint)(iVar2 < (int)uVar77) * iVar2 | (iVar2 >= (int)uVar77) * uVar77;
  auVar69._12_4_ = (uint)(iVar2 < (int)uVar81) * iVar2 | (iVar2 >= (int)uVar81) * uVar81;
  uVar9 = (uint)(iVar2 < (int)uVar43) * iVar2 | (iVar2 >= (int)uVar43) * uVar43;
  uVar12 = (uint)(iVar2 < (int)uVar46) * iVar2 | (iVar2 >= (int)uVar46) * uVar46;
  uVar14 = (uint)(iVar2 < (int)uVar48) * iVar2 | (iVar2 >= (int)uVar48) * uVar48;
  uVar16 = (uint)(iVar2 < (int)uVar50) * iVar2 | (iVar2 >= (int)uVar50) * uVar50;
  auVar38._0_4_ = (uint)(iVar2 < (int)uVar23) * iVar2 | (iVar2 >= (int)uVar23) * uVar23;
  auVar38._4_4_ = (uint)(iVar2 < (int)uVar24) * iVar2 | (iVar2 >= (int)uVar24) * uVar24;
  auVar38._8_4_ = (uint)(iVar2 < (int)uVar25) * iVar2 | (iVar2 >= (int)uVar25) * uVar25;
  auVar38._12_4_ = (uint)(iVar2 < (int)uVar26) * iVar2 | (iVar2 >= (int)uVar26) * uVar26;
  uVar65 = (uint)(iVar2 < (int)uVar65) * iVar2 | (iVar2 >= (int)uVar65) * uVar65;
  uVar72 = (uint)(iVar2 < (int)uVar72) * iVar2 | (iVar2 >= (int)uVar72) * uVar72;
  uVar76 = (uint)(iVar2 < (int)uVar76) * iVar2 | (iVar2 >= (int)uVar76) * uVar76;
  uVar80 = (uint)(iVar2 < (int)uVar80) * iVar2 | (iVar2 >= (int)uVar80) * uVar80;
  auVar18._0_4_ = (uint)(iVar2 < (int)uVar83) * iVar2 | (iVar2 >= (int)uVar83) * uVar83;
  auVar18._4_4_ = (uint)(iVar2 < (int)uVar88) * iVar2 | (iVar2 >= (int)uVar88) * uVar88;
  auVar18._8_4_ = (uint)(iVar2 < (int)uVar90) * iVar2 | (iVar2 >= (int)uVar90) * uVar90;
  auVar18._12_4_ = (uint)(iVar2 < (int)uVar92) * iVar2 | (iVar2 >= (int)uVar92) * uVar92;
  auVar6 = pmulld(auVar44,auVar54);
  auVar10 = pmulld(auVar69,auVar54);
  iVar17 = auVar6._0_4_ + iVar4;
  iVar20 = auVar6._4_4_ + iVar4;
  iVar21 = auVar6._8_4_ + iVar4;
  iVar22 = auVar6._12_4_ + iVar4;
  auVar51 = pmulld(auVar38,auVar54);
  auVar6 = pmulld(auVar18,auVar54);
  iVar11 = auVar51._0_4_ + iVar4;
  iVar13 = auVar51._4_4_ + iVar4;
  iVar15 = auVar51._8_4_ + iVar4;
  iVar4 = auVar51._12_4_ + iVar4;
  iVar94 = iVar17 + auVar10._0_4_ >> auVar7;
  iVar2 = iVar20 + auVar10._4_4_ >> auVar7;
  iVar5 = iVar21 + auVar10._8_4_ >> auVar7;
  iVar8 = iVar22 + auVar10._12_4_ >> auVar7;
  uVar23 = iVar17 - auVar10._0_4_ >> auVar7;
  uVar24 = iVar20 - auVar10._4_4_ >> auVar7;
  uVar25 = iVar21 - auVar10._8_4_ >> auVar7;
  uVar26 = iVar22 - auVar10._12_4_ >> auVar7;
  uVar83 = iVar11 + auVar6._0_4_ >> auVar7;
  uVar88 = iVar13 + auVar6._4_4_ >> auVar7;
  uVar90 = iVar15 + auVar6._8_4_ >> auVar7;
  uVar92 = iVar4 + auVar6._12_4_ >> auVar7;
  iVar11 = iVar11 - auVar6._0_4_ >> auVar7;
  iVar13 = iVar13 - auVar6._4_4_ >> auVar7;
  iVar15 = iVar15 - auVar6._8_4_ >> auVar7;
  iVar4 = iVar4 - auVar6._12_4_ >> auVar7;
  if (do_cols == 0) {
    iVar17 = 10;
    if (10 < bd) {
      iVar17 = bd;
    }
    iVar17 = 0x20 << ((byte)iVar17 & 0x1f);
    iVar20 = -iVar17;
    iVar17 = iVar17 + -1;
    iVar21 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar6 = ZEXT416((uint)out_shift);
    iVar35 = (int)(uVar27 + iVar21) >> auVar6;
    iVar36 = (int)(uVar29 + iVar21) >> auVar6;
    iVar39 = (int)(uVar30 + iVar21) >> auVar6;
    iVar40 = (int)(uVar31 + iVar21) >> auVar6;
    iVar22 = (int)(iVar21 - uVar9) >> auVar6;
    iVar32 = (int)(iVar21 - uVar12) >> auVar6;
    iVar33 = (int)(iVar21 - uVar14) >> auVar6;
    iVar34 = (int)(iVar21 - uVar16) >> auVar6;
    uVar9 = (uint)(iVar35 < iVar20) * iVar20 | (uint)(iVar35 >= iVar20) * iVar35;
    uVar12 = (uint)(iVar36 < iVar20) * iVar20 | (uint)(iVar36 >= iVar20) * iVar36;
    uVar14 = (uint)(iVar39 < iVar20) * iVar20 | (uint)(iVar39 >= iVar20) * iVar39;
    uVar16 = (uint)(iVar40 < iVar20) * iVar20 | (uint)(iVar40 >= iVar20) * iVar40;
    uVar27 = (uint)(iVar17 < (int)uVar9) * iVar17 | (iVar17 >= (int)uVar9) * uVar9;
    uVar29 = (uint)(iVar17 < (int)uVar12) * iVar17 | (iVar17 >= (int)uVar12) * uVar12;
    uVar30 = (uint)(iVar17 < (int)uVar14) * iVar17 | (iVar17 >= (int)uVar14) * uVar14;
    uVar31 = (uint)(iVar17 < (int)uVar16) * iVar17 | (iVar17 >= (int)uVar16) * uVar16;
    uVar9 = (uint)(iVar22 < iVar20) * iVar20 | (uint)(iVar22 >= iVar20) * iVar22;
    uVar12 = (uint)(iVar32 < iVar20) * iVar20 | (uint)(iVar32 >= iVar20) * iVar32;
    uVar14 = (uint)(iVar33 < iVar20) * iVar20 | (uint)(iVar33 >= iVar20) * iVar33;
    uVar16 = (uint)(iVar34 < iVar20) * iVar20 | (uint)(iVar34 >= iVar20) * iVar34;
    uVar9 = (uint)(iVar17 < (int)uVar9) * iVar17 | (iVar17 >= (int)uVar9) * uVar9;
    uVar12 = (uint)(iVar17 < (int)uVar12) * iVar17 | (iVar17 >= (int)uVar12) * uVar12;
    uVar14 = (uint)(iVar17 < (int)uVar14) * iVar17 | (iVar17 >= (int)uVar14) * uVar14;
    uVar16 = (uint)(iVar17 < (int)uVar16) * iVar17 | (iVar17 >= (int)uVar16) * uVar16;
    iVar22 = (int)(uVar83 + iVar21) >> auVar6;
    iVar32 = (int)(uVar88 + iVar21) >> auVar6;
    iVar33 = (int)(uVar90 + iVar21) >> auVar6;
    iVar34 = (int)(uVar92 + iVar21) >> auVar6;
    iVar94 = iVar21 - iVar94 >> auVar6;
    iVar2 = iVar21 - iVar2 >> auVar6;
    iVar5 = iVar21 - iVar5 >> auVar6;
    iVar8 = iVar21 - iVar8 >> auVar6;
    uVar83 = (uint)(iVar22 < iVar20) * iVar20 | (uint)(iVar22 >= iVar20) * iVar22;
    uVar88 = (uint)(iVar32 < iVar20) * iVar20 | (uint)(iVar32 >= iVar20) * iVar32;
    uVar90 = (uint)(iVar33 < iVar20) * iVar20 | (uint)(iVar33 >= iVar20) * iVar33;
    uVar92 = (uint)(iVar34 < iVar20) * iVar20 | (uint)(iVar34 >= iVar20) * iVar34;
    uVar83 = (uint)(iVar17 < (int)uVar83) * iVar17 | (iVar17 >= (int)uVar83) * uVar83;
    uVar88 = (uint)(iVar17 < (int)uVar88) * iVar17 | (iVar17 >= (int)uVar88) * uVar88;
    uVar90 = (uint)(iVar17 < (int)uVar90) * iVar17 | (iVar17 >= (int)uVar90) * uVar90;
    uVar92 = (uint)(iVar17 < (int)uVar92) * iVar17 | (iVar17 >= (int)uVar92) * uVar92;
    uVar43 = (uint)(iVar94 < iVar20) * iVar20 | (uint)(iVar94 >= iVar20) * iVar94;
    uVar46 = (uint)(iVar2 < iVar20) * iVar20 | (uint)(iVar2 >= iVar20) * iVar2;
    uVar48 = (uint)(iVar5 < iVar20) * iVar20 | (uint)(iVar5 >= iVar20) * iVar5;
    uVar50 = (uint)(iVar8 < iVar20) * iVar20 | (uint)(iVar8 >= iVar20) * iVar8;
    uVar43 = (uint)(iVar17 < (int)uVar43) * iVar17 | (iVar17 >= (int)uVar43) * uVar43;
    uVar46 = (uint)(iVar17 < (int)uVar46) * iVar17 | (iVar17 >= (int)uVar46) * uVar46;
    uVar48 = (uint)(iVar17 < (int)uVar48) * iVar17 | (iVar17 >= (int)uVar48) * uVar48;
    uVar50 = (uint)(iVar17 < (int)uVar50) * iVar17 | (iVar17 >= (int)uVar50) * uVar50;
    iVar8 = (int)(uVar23 + iVar21) >> auVar6;
    iVar22 = (int)(uVar24 + iVar21) >> auVar6;
    iVar32 = (int)(uVar25 + iVar21) >> auVar6;
    iVar33 = (int)(uVar26 + iVar21) >> auVar6;
    iVar94 = iVar21 - iVar11 >> auVar6;
    iVar2 = iVar21 - iVar13 >> auVar6;
    iVar5 = iVar21 - iVar15 >> auVar6;
    iVar4 = iVar21 - iVar4 >> auVar6;
    uVar23 = (uint)(iVar8 < iVar20) * iVar20 | (uint)(iVar8 >= iVar20) * iVar8;
    uVar24 = (uint)(iVar22 < iVar20) * iVar20 | (uint)(iVar22 >= iVar20) * iVar22;
    uVar25 = (uint)(iVar32 < iVar20) * iVar20 | (uint)(iVar32 >= iVar20) * iVar32;
    uVar26 = (uint)(iVar33 < iVar20) * iVar20 | (uint)(iVar33 >= iVar20) * iVar33;
    uVar23 = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
    uVar24 = (uint)(iVar17 < (int)uVar24) * iVar17 | (iVar17 >= (int)uVar24) * uVar24;
    uVar25 = (uint)(iVar17 < (int)uVar25) * iVar17 | (iVar17 >= (int)uVar25) * uVar25;
    uVar26 = (uint)(iVar17 < (int)uVar26) * iVar17 | (iVar17 >= (int)uVar26) * uVar26;
    uVar53 = (uint)(iVar94 < iVar20) * iVar20 | (uint)(iVar94 >= iVar20) * iVar94;
    uVar56 = (uint)(iVar2 < iVar20) * iVar20 | (uint)(iVar2 >= iVar20) * iVar2;
    uVar58 = (uint)(iVar5 < iVar20) * iVar20 | (uint)(iVar5 >= iVar20) * iVar5;
    uVar60 = (uint)(iVar4 < iVar20) * iVar20 | (uint)(iVar4 >= iVar20) * iVar4;
    uVar53 = (uint)(iVar17 < (int)uVar53) * iVar17 | (iVar17 >= (int)uVar53) * uVar53;
    uVar56 = (uint)(iVar17 < (int)uVar56) * iVar17 | (iVar17 >= (int)uVar56) * uVar56;
    uVar58 = (uint)(iVar17 < (int)uVar58) * iVar17 | (iVar17 >= (int)uVar58) * uVar58;
    uVar60 = (uint)(iVar17 < (int)uVar60) * iVar17 | (iVar17 >= (int)uVar60) * uVar60;
    iVar94 = (int)(uVar65 + iVar21) >> auVar6;
    iVar2 = (int)(uVar72 + iVar21) >> auVar6;
    iVar4 = (int)(uVar76 + iVar21) >> auVar6;
    iVar5 = (int)(uVar80 + iVar21) >> auVar6;
    iVar8 = (int)(iVar21 - uVar64) >> auVar6;
    iVar11 = (int)(iVar21 - uVar71) >> auVar6;
    iVar13 = (int)(iVar21 - uVar75) >> auVar6;
    iVar15 = (int)(iVar21 - uVar79) >> auVar6;
    uVar64 = (uint)(iVar94 < iVar20) * iVar20 | (uint)(iVar94 >= iVar20) * iVar94;
    uVar71 = (uint)(iVar2 < iVar20) * iVar20 | (uint)(iVar2 >= iVar20) * iVar2;
    uVar75 = (uint)(iVar4 < iVar20) * iVar20 | (uint)(iVar4 >= iVar20) * iVar4;
    uVar79 = (uint)(iVar5 < iVar20) * iVar20 | (uint)(iVar5 >= iVar20) * iVar5;
    uVar65 = (uint)(iVar17 < (int)uVar64) * iVar17 | (iVar17 >= (int)uVar64) * uVar64;
    uVar72 = (uint)(iVar17 < (int)uVar71) * iVar17 | (iVar17 >= (int)uVar71) * uVar71;
    uVar76 = (uint)(iVar17 < (int)uVar75) * iVar17 | (iVar17 >= (int)uVar75) * uVar75;
    uVar80 = (uint)(iVar17 < (int)uVar79) * iVar17 | (iVar17 >= (int)uVar79) * uVar79;
    uVar64 = (uint)(iVar8 < iVar20) * iVar20 | (uint)(iVar8 >= iVar20) * iVar8;
    uVar71 = (uint)(iVar11 < iVar20) * iVar20 | (uint)(iVar11 >= iVar20) * iVar11;
    uVar75 = (uint)(iVar13 < iVar20) * iVar20 | (uint)(iVar13 >= iVar20) * iVar13;
    uVar79 = (uint)(iVar15 < iVar20) * iVar20 | (uint)(iVar15 >= iVar20) * iVar15;
    uVar64 = (uint)(iVar17 < (int)uVar64) * iVar17 | (iVar17 >= (int)uVar64) * uVar64;
    uVar71 = (uint)(iVar17 < (int)uVar71) * iVar17 | (iVar17 >= (int)uVar71) * uVar71;
    uVar75 = (uint)(iVar17 < (int)uVar75) * iVar17 | (iVar17 >= (int)uVar75) * uVar75;
    uVar79 = (uint)(iVar17 < (int)uVar79) * iVar17 | (iVar17 >= (int)uVar79) * uVar79;
  }
  else {
    uVar9 = -uVar9;
    uVar12 = -uVar12;
    uVar14 = -uVar14;
    uVar16 = -uVar16;
    uVar43 = -iVar94;
    uVar46 = -iVar2;
    uVar48 = -iVar5;
    uVar50 = -iVar8;
    uVar53 = -iVar11;
    uVar56 = -iVar13;
    uVar58 = -iVar15;
    uVar60 = -iVar4;
    uVar64 = -uVar64;
    uVar71 = -uVar71;
    uVar75 = -uVar75;
    uVar79 = -uVar79;
  }
  *(uint *)*out = uVar27;
  *(uint *)((long)*out + 4) = uVar29;
  *(uint *)(*out + 1) = uVar30;
  *(uint *)((long)*out + 0xc) = uVar31;
  *(uint *)out[1] = uVar9;
  *(uint *)((long)out[1] + 4) = uVar12;
  *(uint *)(out[1] + 1) = uVar14;
  *(uint *)((long)out[1] + 0xc) = uVar16;
  *(uint *)out[2] = uVar83;
  *(uint *)((long)out[2] + 4) = uVar88;
  *(uint *)(out[2] + 1) = uVar90;
  *(uint *)((long)out[2] + 0xc) = uVar92;
  *(uint *)out[3] = uVar43;
  *(uint *)((long)out[3] + 4) = uVar46;
  *(uint *)(out[3] + 1) = uVar48;
  *(uint *)((long)out[3] + 0xc) = uVar50;
  *(uint *)out[4] = uVar23;
  *(uint *)((long)out[4] + 4) = uVar24;
  *(uint *)(out[4] + 1) = uVar25;
  *(uint *)((long)out[4] + 0xc) = uVar26;
  *(uint *)out[5] = uVar53;
  *(uint *)((long)out[5] + 4) = uVar56;
  *(uint *)(out[5] + 1) = uVar58;
  *(uint *)((long)out[5] + 0xc) = uVar60;
  *(uint *)out[6] = uVar65;
  *(uint *)((long)out[6] + 4) = uVar72;
  *(uint *)(out[6] + 1) = uVar76;
  *(uint *)((long)out[6] + 0xc) = uVar80;
  *(uint *)out[7] = uVar64;
  *(uint *)((long)out[7] + 4) = uVar71;
  *(uint *)(out[7] + 1) = uVar75;
  *(uint *)((long)out[7] + 0xc) = uVar79;
  return;
}

Assistant:

static void iadst8x8_new_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                                int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i kZero = _mm_setzero_si128();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[8], v[8], x;

  // stage 0
  // stage 1
  // stage 2

  u[0] = _mm_mullo_epi32(in[7], cospi4);
  x = _mm_mullo_epi32(in[0], cospi60);
  u[0] = _mm_add_epi32(u[0], x);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_mullo_epi32(in[7], cospi60);
  x = _mm_mullo_epi32(in[0], cospi4);
  u[1] = _mm_sub_epi32(u[1], x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // (2)
  u[2] = _mm_mullo_epi32(in[5], cospi20);
  x = _mm_mullo_epi32(in[2], cospi44);
  u[2] = _mm_add_epi32(u[2], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_mullo_epi32(in[5], cospi44);
  x = _mm_mullo_epi32(in[2], cospi20);
  u[3] = _mm_sub_epi32(u[3], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  // (3)
  u[4] = _mm_mullo_epi32(in[3], cospi36);
  x = _mm_mullo_epi32(in[4], cospi28);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(in[3], cospi28);
  x = _mm_mullo_epi32(in[4], cospi36);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  // (4)
  u[6] = _mm_mullo_epi32(in[1], cospi52);
  x = _mm_mullo_epi32(in[6], cospi12);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(in[1], cospi12);
  x = _mm_mullo_epi32(in[6], cospi52);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 3
  addsub_sse4_1(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  u[5] = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  u[5] = _mm_sub_epi32(u[5], x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_mullo_epi32(v[6], cospim48);
  x = _mm_mullo_epi32(v[7], cospi16);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_mullo_epi32(v[6], cospi16);
  x = _mm_mullo_epi32(v[7], cospim48);
  u[7] = _mm_sub_epi32(u[7], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 5
  addsub_sse4_1(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  u[2] = _mm_add_epi32(v[0], x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(v[0], x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  v[0] = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  u[6] = _mm_add_epi32(v[0], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(v[0], x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
  }
}